

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O1

bool __thiscall
HighsHashTable<int,int>::insert<int&,int&>(HighsHashTable<int,int> *this,int *args,int *args_1)

{
  byte bVar1;
  u8 uVar2;
  long lVar3;
  HighsHashTableEntry<int,_int> HVar4;
  bool bVar5;
  ulong uVar6;
  u8 meta;
  u64 pos;
  Entry entry;
  u64 maxPos;
  u64 startPos;
  u8 local_29;
  ulong local_28;
  HighsHashTableEntry<int,_int> local_20;
  ulong local_18;
  ulong local_10;
  
  local_20.value_ = *args_1;
  local_20.key_ = *args;
  bVar5 = HighsHashTable<int,_int>::findPosition
                    ((HighsHashTable<int,_int> *)this,&local_20.key_,&local_29,&local_10,&local_18,
                     &local_28);
  if (bVar5) {
    bVar5 = false;
  }
  else if ((*(ulong *)(this + 0x20) == *(long *)(this + 0x10) * 7 + 7U >> 3) ||
          (local_28 == local_18)) {
    HighsHashTable<int,_int>::growTable((HighsHashTable<int,_int> *)this);
    bVar5 = insert<HighsHashTableEntry<int,int>>(this,&local_20);
  }
  else {
    lVar3 = *(long *)this;
    *(ulong *)(this + 0x20) = *(ulong *)(this + 0x20) + 1;
    do {
      bVar1 = *(byte *)(*(long *)(this + 8) + local_28);
      if (-1 < (char)bVar1) {
        *(u8 *)(*(long *)(this + 8) + local_28) = local_29;
        *(HighsHashTableEntry<int,_int> *)(lVar3 + local_28 * 8) = local_20;
        goto LAB_00306f21;
      }
      uVar6 = (ulong)((int)local_28 - (uint)bVar1 & 0x7f);
      if (uVar6 < (local_28 - local_10 & *(ulong *)(this + 0x10))) {
        HVar4 = *(HighsHashTableEntry<int,_int> *)(lVar3 + local_28 * 8);
        *(HighsHashTableEntry<int,_int> *)(lVar3 + local_28 * 8) = local_20;
        uVar2 = *(u8 *)(*(long *)(this + 8) + local_28);
        *(u8 *)(*(long *)(this + 8) + local_28) = local_29;
        local_10 = local_28 - uVar6 & *(ulong *)(this + 0x10);
        local_18 = local_10 + 0x7f & *(ulong *)(this + 0x10);
        local_29 = uVar2;
        local_20 = HVar4;
      }
      local_28 = local_28 + 1 & *(ulong *)(this + 0x10);
    } while (local_28 != local_18);
    HighsHashTable<int,_int>::growTable((HighsHashTable<int,_int> *)this);
    insert<HighsHashTableEntry<int,int>>(this,&local_20);
LAB_00306f21:
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }